

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void gai_setup_2d_patch(Integer rank,char *trans,Integer *dims,Integer *lo,Integer *hi,Integer *ilo,
                       Integer *ihi,Integer *jlo,Integer *jhi,Integer *dim1,Integer *dim2,int *ipos,
                       int *jpos,int *vpos,int vec_idx)

{
  Integer IVar1;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 *in_R9;
  int tmp;
  int reset_t;
  char t;
  undefined8 *in_stack_00000008;
  int f;
  int e;
  int d;
  int in_stack_00000048;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  char local_3d [5];
  int local_38;
  int local_34;
  undefined8 *local_30;
  long local_28;
  long local_20;
  long local_18;
  char *local_10;
  long local_8;
  
  local_38 = 0;
  local_3d[1] = '\0';
  local_3d[2] = '\0';
  local_3d[3] = '\0';
  local_3d[4] = '\0';
  local_3d[0] = 'n';
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < local_8; local_34 = local_34 + 1) {
    if ((0 < *(long *)(local_28 + (long)local_34 * 8) - *(long *)(local_20 + (long)local_34 * 8)) &&
       (local_38 = local_38 + 1, 2 < local_38)) {
      pnga_error(in_stack_00000160,in_stack_00000158);
    }
  }
  *(undefined4 *)rank = 0xffffffff;
  trans[0] = -1;
  trans[1] = -1;
  trans[2] = -1;
  trans[3] = -1;
  *(undefined4 *)dims = 0xffffffff;
  local_34 = 0;
  do {
    if (local_8 <= local_34) {
LAB_001fdb73:
      if (((local_38 == 1) && ((int)*dims != 0)) && ((long)(int)*dims != local_8 + -1)) {
        *(int *)rank = (int)*dims;
      }
      if (((int)*dims < 0) && (*(int *)trans < 0)) {
        *(undefined4 *)dims = 0;
        trans[0] = '\x01';
        trans[1] = '\0';
        trans[2] = '\0';
        trans[3] = '\0';
      }
      else {
        if (local_10 == (char *)0x0) {
          local_10 = local_3d;
        }
        if ((*local_10 == 'n') || (*local_10 == 'N')) {
          if ((long)(int)*dims == local_8 + -1) {
            *(int *)dims = (int)*dims + -1;
          }
          if ((int)*dims < 0) {
            *(int *)dims = *(int *)trans + -1;
          }
          if (*(int *)trans < 0) {
            *(int *)trans = (int)*dims + 1;
          }
        }
        else {
          if ((int)*dims < 0) {
            *(int *)dims = *(int *)trans + -1;
          }
          if (*(int *)trans < 0) {
            if (in_stack_00000048 < 0) {
              if ((int)*dims == 0) {
                *(int *)trans = (int)*dims + 1;
              }
              else {
                IVar1 = *dims;
                *(int *)dims = (int)IVar1 + -1;
                *(int *)trans = (int)IVar1;
              }
            }
            else if ((int)*dims < in_stack_00000048) {
              *(int *)trans = in_stack_00000048;
            }
            else if (in_stack_00000048 < (int)*dims) {
              *(int *)trans = (int)*dims;
              *(int *)dims = in_stack_00000048;
            }
            else if ((int)*dims < 1) {
              trans[0] = '\x01';
              trans[1] = '\0';
              trans[2] = '\0';
              trans[3] = '\0';
              *(undefined4 *)dims = 0;
            }
            else {
              *(int *)trans = (int)*dims;
            }
          }
        }
      }
      *local_30 = *(undefined8 *)(local_20 + (long)(int)*dims * 8);
      *in_stack_00000008 = *(undefined8 *)(local_28 + (long)(int)*dims * 8);
      *_e = *(undefined8 *)(local_20 + (long)*(int *)trans * 8);
      *ilo = *(Integer *)(local_28 + (long)*(int *)trans * 8);
      *hi = *(Integer *)(local_18 + (long)(int)*dims * 8);
      *lo = *(Integer *)(local_18 + (long)*(int *)trans * 8);
      return;
    }
    if (((int)*dims < 0) &&
       (*(long *)(local_20 + (long)local_34 * 8) < *(long *)(local_28 + (long)local_34 * 8))) {
      *(int *)dims = local_34;
    }
    else if ((-1 < (int)*dims) &&
            (*(long *)(local_20 + (long)local_34 * 8) < *(long *)(local_28 + (long)local_34 * 8))) {
      *(int *)trans = local_34;
      goto LAB_001fdb73;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static void  gai_setup_2d_patch(Integer rank, char *trans, Integer dims[],
                                Integer lo[], Integer hi[],
                                Integer* ilo, Integer* ihi,
                                Integer* jlo, Integer* jhi,
                                Integer* dim1, Integer* dim2,
                                int* ipos, int* jpos, int *vpos, int vec_idx)
{
    int d,e=0,f=0;
    char t='n';
    int reset_t = 0;
    int tmp;
    
    /* check to see if more than two dimensions of patch have
     * size greater than 1*/
    for(d=0; d<rank; d++)
       if( (hi[d]-lo[d])>0 && ++e>2 ) pnga_error("3-D Patch Detected", 0L);
    /* determine two locations where patch dimensions are greater than 1*/
    *ipos = *jpos = *vpos = -1;
    for(d=0; d<rank; d++){
       if( (*ipos <0) && (hi[d]>lo[d]) ) { *ipos =d; continue; }
       if( (*ipos >=0) && (hi[d]>lo[d])) { *jpos =d; break; }
    }
    /* we have an ambiguous vector; mark its location */
    if (1 == e && *ipos != 0 && *ipos != rank-1) {
        *vpos = *ipos;
    }

    /*    if(*ipos >*jpos){Integer t=*ipos; *ipos=*jpos; *jpos=t;} 
     */
    
    /* single element case (trivial) */
    if((*ipos <0) && (*jpos <0)){ *ipos =0; *jpos=1; }
    else{
       
       if(trans == NULL) {
         trans = &t;      
         reset_t = 1;
       }
       /* handle almost trivial case of only one dimension with >1 elements.
        * None of the conditions in this block are true for a 2D block with more
        * than 1 element in each of the 2 dimensions so no need to specify
        * condition that e == 1 */
       if(*trans == 'n' || *trans == 'N') {
          if(*ipos == rank-1) (*ipos)--; /* i cannot be the last dimension */
          if(*ipos <0) *ipos = *jpos-1; /* select i dimension based on j */
          if(*jpos <0) *jpos = *ipos+1; /* select j dimenison based on i */
       }
       else {
          if(*ipos <0) *ipos = *jpos-1; /* this condition is probably never reached */
          if(*jpos <0) {
            if (vec_idx < 0) {
              if(*ipos==0) *jpos = *ipos + 1; 
              else         *jpos = (*ipos)--;
            } else {
              if (*ipos < vec_idx) {
                *jpos = vec_idx;
              } else if (*ipos > vec_idx) {
                *jpos = *ipos;
                *ipos = vec_idx;
              } else {
                /* this is probably an error if you get this far */
                if (*ipos > 0) {
                  *jpos = *ipos;
		  // fix for -Wunused             *ipos--;
                } else {
                  *jpos = 1;
                  *ipos = 0;
                }
              }
            }
          }
       }
       if (reset_t) trans = NULL;
    }
    
    *ilo = lo[*ipos]; *ihi = hi[*ipos];
    *jlo = lo[*jpos]; *jhi = hi[*jpos];
    *dim1 = dims[*ipos];
    *dim2 = dims[*jpos];
#if 0
    printf("lo/hi=[%ld:%ld", lo[0], hi[0]);
    for (d=1; d<rank; ++d) {
        printf(",%ld:%ld", lo[d], hi[d]);
    }
    printf("]\n");
    printf("size=[%ld", hi[0]-lo[0]+1);
    for (d=1; d<rank; ++d) {
        printf(",%ld", hi[d]-lo[d]+1);
    }
    printf("]\n");
    printf("gai_setup_2d_patch(%ld, T, X, X, X, %ld, %ld, %ld, %ld, %ld, %ld, %d, %d, %d)\n",
            rank, *ilo, *ihi, *jlo, *jhi, *dim1, *dim2, *ipos, *jpos, *vpos);
#endif
}